

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O1

int Cec_ManSimCompareConstFirstBit(uint *p,int nWords)

{
  int i;
  uint uVar1;
  long lVar2;
  
  if ((*p & 1) == 0) {
    if (0 < nWords) {
      lVar2 = 0;
      do {
        if (*p != 0) {
          uVar1 = 0;
          goto LAB_005a0fbe;
        }
        lVar2 = lVar2 + -0x20;
        p = p + 1;
      } while ((ulong)(uint)nWords * 0x20 + lVar2 != 0);
    }
  }
  else if (0 < nWords) {
    lVar2 = 0;
    do {
      if (*p != 0xffffffff) {
        uVar1 = 0;
        goto LAB_005a0fce;
      }
      lVar2 = lVar2 + -0x20;
      p = p + 1;
    } while ((ulong)(uint)nWords * 0x20 + lVar2 != 0);
  }
  return -1;
  while (uVar1 = uVar1 + 1, uVar1 != 0x20) {
LAB_005a0fce:
    if ((*p >> (uVar1 & 0x1f) & 1) == 0) goto LAB_005a0fdf;
  }
  goto LAB_005a0fda;
  while (uVar1 = uVar1 + 1, uVar1 != 0x20) {
LAB_005a0fbe:
    if ((*p >> (uVar1 & 0x1f) & 1) != 0) goto LAB_005a0fdf;
  }
LAB_005a0fda:
  uVar1 = 0xffffffff;
LAB_005a0fdf:
  return uVar1 - (int)lVar2;
}

Assistant:

int Cec_ManSimCompareConstFirstBit( unsigned * p, int nWords )
{
    int w;
    if ( p[0] & 1 )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p[w] != ~0 )
                return 32*w + Gia_WordFindFirstBit( ~p[w] );
        return -1;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p[w] != 0 )
                return 32*w + Gia_WordFindFirstBit( p[w] );
        return -1;
    }
}